

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O1

void eltcalc::setinitdone(int processid)

{
  ostream *poVar1;
  FILE *__stream;
  ostringstream s;
  char *local_1a8;
  char local_198 [16];
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  if (processid != 0) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"work/sema",9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,"_elt/",5);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_188,processid);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,".id",3);
    std::__cxx11::stringbuf::str();
    __stream = fopen(local_1a8,"wb");
    fclose(__stream);
    if (local_1a8 != local_198) {
      operator_delete(local_1a8);
    }
    std::__cxx11::ostringstream::~ostringstream(local_188);
    std::ios_base::~ios_base(local_118);
  }
  return;
}

Assistant:

void setinitdone(int processid)
	{
		if (processid) {
			std::ostringstream s;
			s << SEMA_DIR_PREFIX << "_elt/" << processid << ".id";
			touch(s.str());
		}
	}